

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Offset.h
# Opt level: O1

pair<dg::Offset,_dg::Offset> dg::dda::DefinitionsMap<dg::dda::RWNode>::getInterval(DefSite *ds)

{
  Offset OVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  pair<dg::Offset,_dg::Offset> pVar6;
  Offset OVar5;
  
  OVar1.offset = (ds->offset).offset;
  if (OVar1.offset != Offset::UNKNOWN) {
    uVar4 = (ds->len).offset;
    uVar3 = Offset::UNKNOWN;
    if (uVar4 != Offset::UNKNOWN) {
      uVar3 = uVar4 - 1;
      if (uVar4 == 0) {
        uVar3 = Offset::UNKNOWN;
      }
      if (Offset::UNKNOWN == 1) {
        uVar3 = Offset::UNKNOWN;
      }
    }
    uVar4 = uVar3 + OVar1.offset;
    if (Offset::UNKNOWN - uVar3 <= OVar1.offset) {
      uVar4 = Offset::UNKNOWN;
    }
    OVar5.offset = Offset::UNKNOWN;
    if (OVar1.offset != Offset::UNKNOWN) {
      OVar5.offset = uVar4;
    }
    pVar6.second.offset = OVar5.offset;
    pVar6.first.offset = OVar1.offset;
    return pVar6;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = Offset::UNKNOWN;
  return (pair<dg::Offset,_dg::Offset>)(auVar2 << 0x40);
}

Assistant:

bool isUnknown() const { return offset == UNKNOWN; }